

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

char * __thiscall
cmsys::SystemInformationImplementation::GetVendorID(SystemInformationImplementation *this)

{
  SystemInformationImplementation *this_local;
  
  switch(this->ChipManufacturer) {
  case AMD:
    this_local = (SystemInformationImplementation *)0x1178700;
    break;
  case Intel:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52e79;
    break;
  case NSC:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52e9b;
    break;
  case UMC:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52eeb;
    break;
  case Cyrix:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52ea6;
    break;
  case NexGen:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52ebd;
    break;
  case IDT:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52ed4;
    break;
  case Rise:
    this_local = (SystemInformationImplementation *)0x1178868;
    break;
  case Transmeta:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52f0d;
    break;
  case Sun:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52f18;
    break;
  case IBM:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52f2f;
    break;
  case Motorola:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52f46;
    break;
  case HP:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52f5d;
    break;
  case Hygon:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52f74;
    break;
  case Zhaoxin:
    this_local = (SystemInformationImplementation *)0x117872e;
    break;
  case Apple:
    this_local = (SystemInformationImplementation *)0x1154574;
    break;
  case UnknownManufacturer:
  default:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_1b52fad;
  }
  return (char *)this_local;
}

Assistant:

const char* SystemInformationImplementation::GetVendorID()
{
  // Return the vendor ID.
  switch (this->ChipManufacturer) {
    case Intel:
      return "Intel Corporation";
    case AMD:
      return "Advanced Micro Devices";
    case NSC:
      return "National Semiconductor";
    case Cyrix:
      return "Cyrix Corp., VIA Inc.";
    case NexGen:
      return "NexGen Inc., Advanced Micro Devices";
    case IDT:
      return "IDT\\Centaur, Via Inc., Shanghai Zhaoxin Semiconductor Co., "
             "Ltd.";
    case UMC:
      return "United Microelectronics Corp.";
    case Rise:
      return "Rise";
    case Transmeta:
      return "Transmeta";
    case Sun:
      return "Sun Microelectronics";
    case IBM:
      return "IBM";
    case Motorola:
      return "Motorola";
    case HP:
      return "Hewlett-Packard";
    case Hygon:
      return "Chengdu Haiguang IC Design Co., Ltd.";
    case Zhaoxin:
      return "Shanghai Zhaoxin Semiconductor Co., Ltd.";
    case Apple:
      return "Apple";
    case UnknownManufacturer:
    default:
      return "Unknown Manufacturer";
  }
}